

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int base64encode(char *encoded,char *string,int len)

{
  char *pcVar1;
  char *local_28;
  char *p;
  int i;
  int len_local;
  char *string_local;
  char *encoded_local;
  
  local_28 = encoded;
  for (p._0_4_ = 0; pcVar1 = local_28, (int)p < len + -2; p._0_4_ = (int)p + 3) {
    *local_28 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)((int)string[(int)p] >> 2 & 0x3f)];
    local_28[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(((int)string[(int)p] & 3U) << 4 |
                        (int)((int)string[(int)p + 1] & 0xf0U) >> 4)];
    pcVar1 = local_28 + 3;
    local_28[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(((int)string[(int)p + 1] & 0xfU) << 2 |
                        (int)((int)string[(int)p + 2] & 0xc0U) >> 6)];
    local_28 = local_28 + 4;
    *pcVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(int)((int)string[(int)p + 2] & 0x3f)];
  }
  if ((int)p < len) {
    *local_28 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)((int)string[(int)p] >> 2 & 0x3f)];
    if ((int)p == len + -1) {
      local_28[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)(((int)string[(int)p] & 3U) << 4)];
      local_28[2] = '=';
    }
    else {
      local_28[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)(((int)string[(int)p] & 3U) << 4 |
                          (int)((int)string[(int)p + 1] & 0xf0U) >> 4)];
      local_28[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)(((int)string[(int)p + 1] & 0xfU) << 2)];
    }
    local_28 = local_28 + 3;
    *local_28 = '=';
    local_28 = pcVar1 + 4;
  }
  *local_28 = '\0';
  return ((int)local_28 + 1) - (int)encoded;
}

Assistant:

int base64encode(char *encoded, const char *string, int len)
{
    int i;
    char *p;

    p = encoded;
    for (i = 0; i < len - 2; i += 3)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        *p++ = basis_64[((string[i] & 0x3) << 4) |
                        ((int)(string[i + 1] & 0xF0) >> 4)];
        *p++ = basis_64[((string[i + 1] & 0xF) << 2) |
                        ((int)(string[i + 2] & 0xC0) >> 6)];
        *p++ = basis_64[string[i + 2] & 0x3F];
    }
    if (i < len)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        if (i == (len - 1))
        {
            *p++ = basis_64[((string[i] & 0x3) << 4)];
            *p++ = '=';
        }
        else
        {
            *p++ = basis_64[((string[i] & 0x3) << 4) |
                            ((int)(string[i + 1] & 0xF0) >> 4)];
            *p++ = basis_64[((string[i + 1] & 0xF) << 2)];
        }
        *p++ = '=';
    }

    *p++ = '\0';
    return p - encoded;
}